

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O3

char * tinyfd_colorChooser(char *aTitle,char *aDefaultHexRGB,uchar *aDefaultRGB,uchar *aoResultRGB)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  undefined8 uVar6;
  FILE *__stream;
  char *pcVar7;
  ushort **ppuVar8;
  long lVar9;
  size_t __n;
  undefined4 uVar10;
  uchar lDefaultRGB [3];
  char lDefaultHexRGB [8];
  char lDialogString [1024];
  char lTmp [128];
  byte local_4c7;
  byte local_4c6;
  byte local_4c5;
  int local_4c4;
  char local_4c0 [8];
  char local_4b8 [4];
  undefined1 auStack_4b4 [2];
  undefined1 uStack_4b2;
  undefined1 auStack_4b1 [9];
  char acStack_4a8 [8];
  char acStack_4a0 [8];
  char acStack_498 [8];
  char acStack_490 [14];
  char acStack_482 [970];
  char local_b8 [136];
  
  tinyfd_colorChooser::lBuff[0] = '\0';
  if (aDefaultHexRGB == (char *)0x0) {
    local_4c7 = *aDefaultRGB;
    local_4c6 = aDefaultRGB[1];
    local_4c5 = aDefaultRGB[2];
    aDefaultHexRGB = local_4c0;
    sprintf(aDefaultHexRGB,"#%02hhx%02hhx%02hhx",(ulong)local_4c7);
  }
  else {
    Hex2RGB(aDefaultHexRGB,&local_4c7);
  }
  iVar3 = osascriptPresent();
  if (iVar3 == 0) {
    iVar4 = kdialogPresent();
    if (iVar4 == 0) {
      iVar4 = zenity3Present();
      if ((iVar4 == 0) && (iVar4 = matedialogPresent(), iVar4 == 0)) {
        if (shellementaryPresent_lShellementaryPresent == '\0') {
          shellementaryPresent_lShellementaryPresent = '\x01';
        }
        iVar4 = qarmaPresent();
        if (iVar4 == 0) {
          iVar4 = xdialogPresent();
          if (iVar4 != 0) {
            if (aTitle == (char *)0x0) {
              builtin_strncpy(local_4b8,"Xdia",4);
              auStack_4b4 = (undefined1  [2])0x6f6c;
              uStack_4b2 = 0x67;
              auStack_4b1[0] = 0x20;
              auStack_4b1._1_2_ = 0x2d2d;
              auStack_4b1[3] = 99;
              auStack_4b1._4_2_ = 0x6c6f;
              auStack_4b1._6_3_ = 0x73726f;
              builtin_strncpy(acStack_4a8,"el \"",5);
              local_4c4 = iVar3;
            }
            else {
              iVar4 = strcmp(aTitle,"tinyfd_query");
              if (iVar4 == 0) {
                uVar6 = 0x676f6c61696478;
                goto LAB_00119206;
              }
              builtin_strncpy(local_4b8,"Xdia",4);
              auStack_4b4 = (undefined1  [2])0x6f6c;
              uStack_4b2 = 0x67;
              auStack_4b1[0] = 0x20;
              auStack_4b1._1_2_ = 0x2d2d;
              auStack_4b1[3] = 99;
              auStack_4b1._4_2_ = 0x6c6f;
              auStack_4b1._6_3_ = 0x73726f;
              builtin_strncpy(acStack_4a8,"el \"",5);
              local_4c4 = iVar3;
              if (*aTitle != '\0') {
                strcat(local_4b8,aTitle);
              }
            }
            sVar5 = strlen(local_4b8);
            builtin_strncpy(local_4b8 + sVar5,"\" 0 60 ",8);
            sprintf(local_b8,"%hhu %hhu %hhu",(ulong)local_4c7,(ulong)local_4c6,(ulong)local_4c5);
            strcat(local_4b8,local_b8);
            sVar5 = strlen(local_4b8);
            builtin_strncpy(local_4b8 + sVar5," 2>&",4);
            *(undefined2 *)(auStack_4b4 + sVar5) = 0x31;
            bVar2 = true;
            bVar1 = 1;
            goto LAB_00119358;
          }
          iVar4 = tkinter2Present();
          if (iVar4 != 0) {
            if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
              uVar10._0_1_ = 'o';
              uVar10._1_1_ = 'n';
              uVar10._2_1_ = '2';
              uVar10._3_1_ = '-';
LAB_001198df:
              tinyfd_response._4_2_ = (undefined2)uVar10;
              tinyfd_response[6] = SUB41(uVar10,2);
              builtin_strncpy(tinyfd_response + 8,"tkinter",8);
              tinyfd_response[7] = SUB41(uVar10,3);
              builtin_strncpy(tinyfd_response,"pyth",4);
              return (char *)0x1;
            }
            strcpy(local_4b8,gPython2Name);
            iVar4 = isTerminalRunning();
            if ((iVar4 == 0) && (iVar4 = isDarwin(), iVar4 != 0)) {
              sVar5 = strlen(local_4b8);
              builtin_strncpy(local_4b8 + sVar5," -i",4);
            }
            local_4c4 = iVar3;
            sVar5 = strlen(local_4b8);
            memcpy(local_4b8 + sVar5,
                   " -S -c \"import Tkinter,tkColorChooser;root=Tkinter.Tk();root.withdraw();",0x49)
            ;
            iVar3 = isDarwin();
            if (iVar3 != 0) {
              sVar5 = strlen(local_4b8);
              memcpy(local_4b8 + sVar5,
                     "import os;os.system(\'\'\'osascript -e \'tell app \\\"Finder\\\" to set frontmost of process \\\"Python\\\" to true\' \'\'\');"
                     ,0x6f);
            }
            sVar5 = strlen(local_4b8);
            builtin_strncpy(local_4b8 + sVar5,"res=tkCo",8);
            builtin_strncpy(auStack_4b1 + sVar5 + 1,"lorChoos",8);
            builtin_strncpy(acStack_4a8 + sVar5,"er.askco",8);
            builtin_strncpy(acStack_4a0 + sVar5,"lor(colo",8);
            builtin_strncpy(acStack_498 + sVar5,"r=\'",4);
            strcat(local_4b8,aDefaultHexRGB);
            sVar5 = strlen(local_4b8);
            (local_4b8 + sVar5)[0] = '\'';
            (local_4b8 + sVar5)[1] = '\0';
            if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
              sVar5 = strlen(local_4b8);
              builtin_strncpy(local_4b8 + sVar5,",title=\'",8);
              auStack_4b1[sVar5 + 1] = 0;
              strcat(local_4b8,aTitle);
              sVar5 = strlen(local_4b8);
              (local_4b8 + sVar5)[0] = '\'';
              (local_4b8 + sVar5)[1] = '\0';
            }
            sVar5 = strlen(local_4b8);
            builtin_strncpy(local_4b8 + sVar5,");\nif re",8);
            builtin_strncpy(auStack_4b1 + sVar5 + 1,"s[1] is ",8);
            builtin_strncpy(acStack_4a8 + sVar5,"not None",8);
            builtin_strncpy(acStack_4a0 + sVar5,":\n\tprint ",9);
            builtin_strncpy(acStack_498 + sVar5 + 1,"res[1]\"",8);
            bVar2 = true;
            goto LAB_00119355;
          }
          iVar4 = tkinter3Present();
          if (iVar4 == 0) {
            if (aTitle == (char *)0x0) {
              aTitle = (char *)0x0;
            }
            else {
              iVar3 = strcmp(aTitle,"tinyfd_query");
              if (iVar3 == 0) {
                pcVar7 = tinyfd_inputBox(aTitle,(char *)0x0,(char *)0x0);
                return pcVar7;
              }
            }
            pcVar7 = tinyfd_inputBox(aTitle,"Enter hex rgb color (i.e. #f5ca20)",aDefaultHexRGB);
            if (pcVar7 == (char *)0x0) {
              return (char *)0x0;
            }
            sVar5 = strlen(pcVar7);
            if (sVar5 != 7) {
              return (char *)0x0;
            }
            if (*pcVar7 != '#') {
              return (char *)0x0;
            }
            ppuVar8 = __ctype_b_loc();
            lVar9 = 1;
            do {
              if ((*(byte *)((long)*ppuVar8 + (long)pcVar7[lVar9] * 2 + 1) & 0x10) == 0) {
                return (char *)0x0;
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 != 7);
            goto LAB_0011945c;
          }
          if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
            uVar10._0_1_ = 'o';
            uVar10._1_1_ = 'n';
            uVar10._2_1_ = '3';
            uVar10._3_1_ = '-';
            goto LAB_001198df;
          }
          local_4c4 = iVar3;
          strcpy(local_4b8,gPython3Name);
          sVar5 = strlen(local_4b8);
          memcpy(local_4b8 + sVar5,
                 " -S -c \"import tkinter;from tkinter import colorchooser;root=tkinter.Tk();root.withdraw();"
                 ,0x5b);
          sVar5 = strlen(local_4b8);
          (acStack_498 + sVar5)[0] = '\'';
          (acStack_498 + sVar5)[1] = '\0';
          builtin_strncpy(local_4b8 + sVar5,"res=colo",8);
          builtin_strncpy(auStack_4b1 + sVar5 + 1,"rchooser",8);
          builtin_strncpy(acStack_4a8 + sVar5,".askcolo",8);
          builtin_strncpy(acStack_4a0 + sVar5,"r(color=",8);
          strcat(local_4b8,aDefaultHexRGB);
          sVar5 = strlen(local_4b8);
          (local_4b8 + sVar5)[0] = '\'';
          (local_4b8 + sVar5)[1] = '\0';
          if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
            sVar5 = strlen(local_4b8);
            builtin_strncpy(local_4b8 + sVar5,",title=\'",8);
            auStack_4b1[sVar5 + 1] = 0;
            strcat(local_4b8,aTitle);
            sVar5 = strlen(local_4b8);
            (local_4b8 + sVar5)[0] = '\'';
            (local_4b8 + sVar5)[1] = '\0';
          }
          sVar5 = strlen(local_4b8);
          builtin_strncpy(local_4b8 + sVar5,");\nif re",8);
          builtin_strncpy(auStack_4b1 + sVar5 + 1,"s[1] is ",8);
          builtin_strncpy(acStack_4a8 + sVar5,"not None",8);
          builtin_strncpy(acStack_4a0 + sVar5,":\n\tprint(r",10);
          builtin_strncpy(acStack_498 + sVar5 + 2,"es[1])\"",8);
          goto LAB_001190d1;
        }
      }
      iVar4 = zenity3Present();
      if (iVar4 == 0) {
        iVar4 = matedialogPresent();
        if (iVar4 == 0) {
          if (shellementaryPresent_lShellementaryPresent == '\0') {
            shellementaryPresent_lShellementaryPresent = '\x01';
          }
          if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
            builtin_strncpy(tinyfd_response,"qarma",6);
            return (char *)0x1;
          }
          auStack_4b4 = (undefined1  [2])0x61;
          builtin_strncpy(local_4b8,"qarm",4);
          local_4c4 = iVar3;
          pcVar7 = getenv("SSH_TTY");
          if (pcVar7 == (char *)0x0) {
            sVar5 = strlen(local_4b8);
            pcVar7 = " --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)";
            __n = 0x41;
            goto LAB_00119286;
          }
        }
        else {
          if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
            builtin_strncpy(tinyfd_response,"matedialog",0xb);
            return (char *)0x1;
          }
          builtin_strncpy(local_4b8,"mate",4);
          auStack_4b4 = (undefined1  [2])0x6964;
          uStack_4b2 = 0x61;
          auStack_4b1[0] = 0x6c;
          auStack_4b1._1_2_ = 0x676f;
          auStack_4b1[3] = 0;
          local_4c4 = iVar3;
        }
      }
      else {
        if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
          uVar6 = 0x337974696e657a;
LAB_00119206:
          tinyfd_response._0_4_ = (undefined4)uVar6;
          tinyfd_response._4_2_ = (undefined2)((ulong)uVar6 >> 0x20);
          tinyfd_response[6] = (char)((ulong)uVar6 >> 0x30);
          tinyfd_response._7_4_ = tinyfd_response._7_4_ & 0xffffff00;
          return (char *)0x1;
        }
        auStack_4b4 = (undefined1  [2])0x7974;
        uStack_4b2 = 0;
        builtin_strncpy(local_4b8,"zeni",4);
        local_4c4 = iVar3;
        iVar3 = zenity3Present();
        if ((3 < iVar3) && (pcVar7 = getenv("SSH_TTY"), pcVar7 == (char *)0x0)) {
          sVar5 = strlen(local_4b8);
          pcVar7 = " --attach=$(sleep .01;xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)";
          __n = 0x4b;
LAB_00119286:
          memcpy(local_4b8 + sVar5,pcVar7,__n);
        }
      }
      sVar5 = strlen(local_4b8);
      builtin_strncpy(local_4b8 + sVar5," --color",8);
      builtin_strncpy(auStack_4b1 + sVar5 + 1,"-selecti",8);
      builtin_strncpy(acStack_4a8 + sVar5,"on --sho",8);
      builtin_strncpy(acStack_4a0 + sVar5,"w-palett",8);
      (acStack_498 + sVar5)[0] = 'e';
      (acStack_498 + sVar5)[1] = '\0';
      sVar5 = strlen(local_4b8);
      sprintf(local_4b8 + sVar5," --color=%s",aDefaultHexRGB);
      if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
        sVar5 = strlen(local_4b8);
        builtin_strncpy(local_4b8 + sVar5," --title",8);
        *(undefined4 *)(auStack_4b1 + sVar5) = 0x223d65;
        strcat(local_4b8,aTitle);
        sVar5 = strlen(local_4b8);
        (local_4b8 + sVar5)[0] = '\"';
        (local_4b8 + sVar5)[1] = '\0';
      }
      if (tinyfd_silent != 0) {
        sVar5 = strlen(local_4b8);
        builtin_strncpy(local_4b8 + sVar5," 2>/dev/",8);
        *(undefined8 *)(&uStack_4b2 + sVar5) = 0x206c6c756e2f76;
      }
      bVar2 = false;
    }
    else {
      if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
        uVar6 = 0x676f6c6169646b;
        goto LAB_00119206;
      }
      builtin_strncpy(local_4b8,"kdia",4);
      auStack_4b4 = (undefined1  [2])0x6f6c;
      uStack_4b2 = 0x67;
      auStack_4b1[0] = 0;
      local_4c4 = iVar3;
      iVar3 = kdialogPresent();
      if (iVar3 == 2) {
        sVar5 = strlen(local_4b8);
        memcpy(local_4b8 + sVar5,
               " --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)",0x41);
      }
      sVar5 = strlen(local_4b8);
      bVar1 = 0;
      sprintf(local_4b8 + sVar5," --getcolor --default \'%s\'",aDefaultHexRGB);
      bVar2 = true;
      if (aTitle == (char *)0x0) goto LAB_00119358;
      bVar2 = true;
      if (*aTitle != '\0') {
        sVar5 = strlen(local_4b8);
        builtin_strncpy(local_4b8 + sVar5," --title",8);
        *(undefined4 *)(auStack_4b1 + sVar5) = 0x222065;
        strcat(local_4b8,aTitle);
        sVar5 = strlen(local_4b8);
        (local_4b8 + sVar5)[0] = '\"';
        (local_4b8 + sVar5)[1] = '\0';
      }
    }
LAB_00119355:
    bVar1 = 0;
  }
  else {
    if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
      builtin_strncpy(tinyfd_response,"applescript",0xc);
      return (char *)0x1;
    }
    builtin_strncpy(local_4b8,"osas",4);
    auStack_4b4 = (undefined1  [2])0x7263;
    uStack_4b2 = 0x69;
    auStack_4b1[0] = 0x70;
    auStack_4b1._1_2_ = 0x74;
    iVar4 = osx9orBetter();
    sVar5 = strlen(local_4b8);
    if (iVar4 == 0) {
      builtin_strncpy(acStack_498 + sVar5,"ents\"\' -",8);
      builtin_strncpy(acStack_490 + sVar5,"e \'Activate\'",0xd);
      builtin_strncpy(acStack_4a8 + sVar5,"ation \"S",8);
      builtin_strncpy(acStack_4a0 + sVar5,"ystem Ev",8);
      builtin_strncpy(local_4b8 + sVar5," -e \'tel",8);
      builtin_strncpy(auStack_4b1 + sVar5 + 1,"l applic",8);
      local_4c4 = iVar3;
      sVar5 = strlen(local_4b8);
      builtin_strncpy(local_4b8 + sVar5," -e \'try",8);
      builtin_strncpy(auStack_4b1 + sVar5 + 1,"\' -e \'se",8);
      builtin_strncpy(acStack_4a8 + sVar5,"t mycolo",8);
      builtin_strncpy(acStack_4a0 + sVar5,"r to cho",8);
      builtin_strncpy(acStack_498 + sVar5,"ose colo",8);
      builtin_strncpy(acStack_490 + sVar5,"r default colo",0xe);
      builtin_strncpy(acStack_482 + sVar5,"r {",4);
    }
    else {
      local_4c4 = iVar3;
      memcpy(local_4b8 + sVar5,
             " -e \'try\' -e \'tell app (path to frontmost application as Unicode text) to set mycolor to choose color default color {"
             ,0x76);
    }
    sprintf(local_b8,"%d",(ulong)local_4c7 << 8);
    strcat(local_4b8,local_b8);
    sVar5 = strlen(local_4b8);
    (local_4b8 + sVar5)[0] = ',';
    (local_4b8 + sVar5)[1] = '\0';
    sprintf(local_b8,"%d",(ulong)local_4c6 << 8);
    strcat(local_4b8,local_b8);
    sVar5 = strlen(local_4b8);
    (local_4b8 + sVar5)[0] = ',';
    (local_4b8 + sVar5)[1] = '\0';
    sprintf(local_b8,"%d",(ulong)local_4c5 << 8);
    strcat(local_4b8,local_b8);
    sVar5 = strlen(local_4b8);
    builtin_strncpy(local_4b8 + sVar5,"}\' ",4);
    sVar5 = strlen(local_4b8);
    memcpy(local_4b8 + sVar5,
           "-e \'set mystring to ((item 1 of mycolor) div 256 as integer) as string\' ",0x49);
    sVar5 = strlen(local_4b8);
    builtin_strncpy(local_4b8 + sVar5,"-e \'repe",8);
    builtin_strncpy(auStack_4b1 + sVar5 + 1,"at with ",8);
    builtin_strncpy(acStack_4a8 + sVar5,"i from 2",8);
    builtin_strncpy(acStack_4a0 + sVar5," to the ",8);
    builtin_strncpy(acStack_498 + sVar5,"count of",8);
    builtin_strncpy(acStack_490 + sVar5," mycolor\' ",0xb);
    sVar5 = strlen(local_4b8);
    memcpy(local_4b8 + sVar5,
           "-e \'set mystring to mystring & \" \" & ((item i of mycolor) div 256 as integer) as string\' "
           ,0x5a);
    sVar5 = strlen(local_4b8);
    builtin_strncpy(local_4b8 + sVar5,"-e \'end ",8);
    builtin_strncpy(auStack_4b1 + sVar5 + 1,"repeat\' ",8);
    acStack_4a8[sVar5] = '\0';
    sVar5 = strlen(local_4b8);
    builtin_strncpy(local_4b8 + sVar5,"-e \'myst",8);
    *(undefined8 *)(auStack_4b1 + sVar5) = 0x2027676e697274;
    sVar5 = strlen(local_4b8);
    builtin_strncpy(local_4b8 + sVar5,"-e \'on e",8);
    builtin_strncpy(auStack_4b1 + sVar5 + 1,"rror number",0xb);
    builtin_strncpy(acStack_4a8 + sVar5 + 3," -128\' ",8);
    sVar5 = strlen(local_4b8);
    builtin_strncpy(local_4b8 + sVar5,"-e \'end ",8);
    *(undefined8 *)(auStack_4b4 + sVar5 + 1) = 0x2779727420646e;
    iVar3 = osx9orBetter();
    if (iVar3 == 0) {
      sVar5 = strlen(local_4b8);
      builtin_strncpy(local_4b8 + sVar5," -e \'end",8);
      *(undefined8 *)(auStack_4b1 + sVar5) = 0x276c6c65742064;
    }
LAB_001190d1:
    bVar1 = 0;
    bVar2 = true;
  }
LAB_00119358:
  if (tinyfd_verbose != 0) {
    printf("lDialogString: %s\n",local_4b8);
  }
  __stream = popen(local_4b8,"r");
  if (__stream != (FILE *)0x0) {
    do {
      pcVar7 = fgets(tinyfd_colorChooser::lBuff,0x80,__stream);
    } while (pcVar7 != (char *)0x0);
    pclose(__stream);
    sVar5 = strlen(tinyfd_colorChooser::lBuff);
    if (sVar5 != 0) {
      if (tinyfd_selectFolderDialog::lBuff[sVar5 + 0x3ff] == '\n') {
        tinyfd_selectFolderDialog::lBuff[sVar5 + 0x3ff] = '\0';
      }
      if (bVar2) {
        if ((bool)(local_4c4 == 0 & (bVar1 ^ 1))) {
          pcVar7 = tinyfd_colorChooser::lBuff;
LAB_0011945c:
          Hex2RGB(pcVar7,aoResultRGB);
          return pcVar7;
        }
        pcVar7 = "%hhu %hhu %hhu";
      }
      else {
        if (tinyfd_colorChooser::lBuff[0] == '#') {
          pcVar7 = tinyfd_colorChooser::lBuff;
          sVar5 = strlen(tinyfd_colorChooser::lBuff);
          if (7 < sVar5) {
            tinyfd_colorChooser::lBuff[3] = tinyfd_colorChooser::lBuff[5];
            tinyfd_colorChooser::lBuff[4] = tinyfd_colorChooser::lBuff[6];
            tinyfd_colorChooser::lBuff[5] = tinyfd_colorChooser::lBuff[9];
            tinyfd_colorChooser::lBuff[6] = tinyfd_colorChooser::lBuff[10];
            tinyfd_colorChooser::lBuff[7] = '\0';
          }
          goto LAB_0011945c;
        }
        if (tinyfd_colorChooser::lBuff[3] == '(') {
          pcVar7 = "rgb(%hhu,%hhu,%hhu";
        }
        else {
          if (tinyfd_colorChooser::lBuff[4] != '(') {
            return tinyfd_colorChooser::lBuff;
          }
          pcVar7 = "rgba(%hhu,%hhu,%hhu";
        }
      }
      __isoc99_sscanf(tinyfd_colorChooser::lBuff,pcVar7,aoResultRGB,aoResultRGB + 1,aoResultRGB + 2)
      ;
      RGB2Hex(aoResultRGB,tinyfd_colorChooser::lBuff);
      return tinyfd_colorChooser::lBuff;
    }
  }
  return (char *)0x0;
}

Assistant:

char const * tinyfd_colorChooser(
        char const * const aTitle, /* NULL or "" */
        char const * const aDefaultHexRGB, /* NULL or "#FF0000"*/
        unsigned char const aDefaultRGB[3], /* { 0 , 255 , 255 } */
        unsigned char aoResultRGB[3]) /* { 0 , 0 , 0 } */
{
        char lDefaultHexRGB[8];
        char * lpDefaultHexRGB;
        int i;
        char const * p ;

#ifndef TINYFD_NOLIB
        if ( (!tinyfd_forceConsole || !( GetConsoleWindow() || dialogPresent()) )
          && (!getenv("SSH_CLIENT") || getenv("DISPLAY")) )
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"windows");return (char const *)1;}
                if (tinyfd_winUtf8)
                {
                        return colorChooserWinGui8(
                                aTitle, aDefaultHexRGB, aDefaultRGB, aoResultRGB);
                }
                else
                {
                        return colorChooserWinGuiA(
                                aTitle, aDefaultHexRGB, aDefaultRGB, aoResultRGB);
                }
        }
        else
#endif /* TINYFD_NOLIB */
        if ( aDefaultHexRGB )
        {
                lpDefaultHexRGB = (char *) aDefaultHexRGB ;
        }
        else
        {
                RGB2Hex( aDefaultRGB , lDefaultHexRGB ) ;
                lpDefaultHexRGB = (char *) lDefaultHexRGB ;
        }
        p = tinyfd_inputBox(aTitle,
                        "Enter hex rgb color (i.e. #f5ca20)",lpDefaultHexRGB);
        if (aTitle&&!strcmp(aTitle,"tinyfd_query")) return p;

        if ( !p || (strlen(p) != 7) || (p[0] != '#') )
        {
                return NULL ;
        }
        for ( i = 1 ; i < 7 ; i ++ )
        {
                if ( ! isxdigit( p[i] ) )
                {
                        return NULL ;
                }
        }
        Hex2RGB(p,aoResultRGB);
        return p ;
}